

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerAcquireMapPage(Pager *pPager,Pgno pgno,void *pData,PgHdr **ppPage)

{
  PgHdr *__s;
  u64 n;
  
  __s = pPager->pMmapFreelist;
  if (__s == (PgHdr *)0x0) {
    n = (ulong)pPager->nExtra + 0x48;
    __s = (PgHdr *)sqlite3Malloc(n);
    if (__s == (PgHdr *)0x0) {
      *ppPage = (PgHdr *)0x0;
      (*pPager->fd->pMethods->xUnfetch)(pPager->fd,(long)pPager->pageSize * (ulong)(pgno - 1),pData)
      ;
      return 7;
    }
    memset(__s,0,n);
    *ppPage = __s;
    __s->pExtra = __s + 1;
    __s->flags = 0x40;
    __s->nRef = 1;
    __s->pPager = pPager;
  }
  else {
    *ppPage = __s;
    pPager->pMmapFreelist = __s->pDirty;
    __s->pDirty = (PgHdr *)0x0;
    memset(__s->pExtra,0,(ulong)pPager->nExtra);
  }
  __s->pgno = pgno;
  __s->pData = pData;
  pPager->nMmapOut = pPager->nMmapOut + 1;
  return 0;
}

Assistant:

static int pagerAcquireMapPage(
  Pager *pPager,                  /* Pager object */
  Pgno pgno,                      /* Page number */
  void *pData,                    /* xFetch()'d data for this page */
  PgHdr **ppPage                  /* OUT: Acquired page object */
){
  PgHdr *p;                       /* Memory mapped page to return */
  
  if( pPager->pMmapFreelist ){
    *ppPage = p = pPager->pMmapFreelist;
    pPager->pMmapFreelist = p->pDirty;
    p->pDirty = 0;
    memset(p->pExtra, 0, pPager->nExtra);
  }else{
    *ppPage = p = (PgHdr *)sqlite3MallocZero(sizeof(PgHdr) + pPager->nExtra);
    if( p==0 ){
      sqlite3OsUnfetch(pPager->fd, (i64)(pgno-1) * pPager->pageSize, pData);
      return SQLITE_NOMEM;
    }
    p->pExtra = (void *)&p[1];
    p->flags = PGHDR_MMAP;
    p->nRef = 1;
    p->pPager = pPager;
  }

  assert( p->pExtra==(void *)&p[1] );
  assert( p->pPage==0 );
  assert( p->flags==PGHDR_MMAP );
  assert( p->pPager==pPager );
  assert( p->nRef==1 );

  p->pgno = pgno;
  p->pData = pData;
  pPager->nMmapOut++;

  return SQLITE_OK;
}